

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.cpp
# Opt level: O1

void __thiscall Party::Msg(Party *this,Character *from,string *message,bool echo)

{
  World *pWVar1;
  Character *this_00;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  mapped_type *this_01;
  long *plVar5;
  size_type *psVar6;
  pointer ppCVar7;
  PacketBuilder builder;
  string local_168;
  string local_148;
  key_type local_128;
  pointer local_108;
  string local_100;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [48];
  string local_70;
  string local_50;
  
  pWVar1 = this->world;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"ChatMaxWidth","");
  this_01 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar1->config,&local_128);
  iVar3 = util::variant::GetInt(this_01);
  (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_70,from);
  util::ucfirst(&local_50,&local_70);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_100.field_2._M_allocated_capacity = *psVar6;
    local_100.field_2._8_8_ = plVar5[3];
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar6;
    local_100._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_100._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  iVar4 = util::text_width(&local_100);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"...","");
  util::text_cap((string *)local_a0,message,iVar3 - iVar4,&local_c0);
  std::__cxx11::string::operator=((string *)message,(string *)local_a0);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  PacketBuilder::PacketBuilder
            ((PacketBuilder *)local_a0,PACKET_TALK,PACKET_OPEN,message->_M_string_length + 2);
  iVar3 = Character::PlayerID(from);
  PacketBuilder::AddShort((PacketBuilder *)local_a0,iVar3);
  PacketBuilder::AddString((PacketBuilder *)local_a0,message);
  ppCVar7 = (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_108 = (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (ppCVar7 != local_108) {
    do {
      this_00 = *ppCVar7;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"\'","");
      (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_e0,from);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      pcVar2 = (message->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_168,pcVar2,pcVar2 + message->_M_string_length);
      Character::AddChatLog(this_00,&local_148,&local_e0,&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (this_00 != from || echo) {
        Character::Send(this_00,(PacketBuilder *)local_a0);
      }
      ppCVar7 = ppCVar7 + 1;
    } while (ppCVar7 != local_108);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_a0);
  return;
}

Assistant:

void Party::Msg(Character *from, std::string message, bool echo)
{
	message = util::text_cap(message, static_cast<int>(this->world->config["ChatMaxWidth"]) - util::text_width(util::ucfirst(from->SourceName()) + "  "));

	PacketBuilder builder(PACKET_TALK, PACKET_OPEN, 2 + message.length());

	builder.AddShort(from->PlayerID());
	builder.AddString(message);

	UTIL_FOREACH(this->members, member)
	{
		member->AddChatLog("'", from->SourceName(), message);

		if (!echo && member == from)
			continue;

		member->Send(builder);
	}
}